

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::processTimingTick(CommonCore *this,ActionMessage *cmd)

{
  uint uVar1;
  FederateState *this_00;
  string_view message;
  string_view message_00;
  FederateStates FVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  FedInfo **ppFVar7;
  uint uVar8;
  FedInfo **ppFVar9;
  FedInfo *pFVar10;
  FedInfo **ppFVar11;
  string_view name;
  string_view name_00;
  ActionMessage bye;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  if ((((cmd->messageID & 3) != 0) && ((this->super_BrokerBase).brokerState._M_i == OPERATING)) &&
     (TimeoutMonitor::tick
                ((this->timeoutMon)._M_t.
                 super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>
                 .super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl,this),
     5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i)) {
    message._M_str = " core tick";
    message._M_len = 10;
    name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    name._M_len = (this->super_BrokerBase).identifier._M_string_length;
    BrokerBase::sendToLogger
              (&this->super_BrokerBase,
               (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,6,name,message,
               false);
  }
  if ((cmd->messageID & 4) != 0) {
    checkQueryTimeouts(this);
  }
  if ((cmd->messageID & 0x10) == 0) {
    return;
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar4 = lVar4 - (this->super_BrokerBase).disconnectTime.__d.__r;
  lVar6 = ((this->super_BrokerBase).tickTimer.internalTimeCode * 3) / 1000000;
  lVar5 = lVar6 * 1000000;
  if (lVar4 == lVar5 || SBORROW8(lVar4,lVar5) != lVar4 + lVar6 * -1000000 < 0) {
    return;
  }
  message_00._M_str = " disconnect Timer expired forcing disconnect";
  message_00._M_len = 0x2c;
  name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
  name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
  BrokerBase::sendToLogger
            (&this->super_BrokerBase,
             (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name_00,
             message_00,false);
  ActionMessage::ActionMessage(&local_e8,cmd_disconnect_fed_ack);
  local_e8.source_id.gid = 0;
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar3 = (this->loopFederates).dataStorage.bsize;
    ppFVar11 = (this->loopFederates).dataStorage.dataptr;
    if ((long)(int)uVar3 != 0x20) {
      ppFVar11 = ppFVar11 + (this->loopFederates).dataStorage.dataSlotIndex;
      pFVar10 = *ppFVar11 + (int)uVar3;
      goto LAB_002b31b9;
    }
    if (ppFVar11 == (FedInfo **)0x0) {
      ppFVar11 = &gmlc::containers::
                  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                  emptyValue;
    }
    else {
      ppFVar11 = ppFVar11 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
    }
  }
  else {
    ppFVar11 = (this->loopFederates).dataStorage.dataptr;
  }
  pFVar10 = *ppFVar11;
  uVar3 = 0;
LAB_002b31b9:
  uVar1 = (this->loopFederates).dataStorage.bsize;
  ppFVar7 = (this->loopFederates).dataStorage.dataptr;
  lVar6 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar7 == (FedInfo **)0x0) {
    ppFVar9 = &gmlc::containers::
               StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
               emptyValue;
  }
  else {
    ppFVar9 = ppFVar7 + lVar6 + 1;
  }
  uVar8 = 0;
  if (uVar1 != 0x20) {
    uVar8 = uVar1;
  }
  ppFVar7 = ppFVar7 + lVar6;
  if (uVar1 == 0x20) {
    ppFVar7 = ppFVar9;
  }
  while ((uVar3 != uVar8 || (ppFVar11 != ppFVar7))) {
    this_00 = pFVar10->fed;
    FVar2 = FederateState::getState(this_00);
    if (FVar2 != FINISHED) {
      local_e8.dest_id.gid = (this_00->global_id)._M_i.gid;
      FederateState::addAction(this_00,&local_e8);
    }
    if ((int)uVar3 < 0x1f) {
      pFVar10 = pFVar10 + 1;
      uVar3 = uVar3 + 1;
    }
    else {
      ppFVar11 = ppFVar11 + (ulong)(uVar3 - 0x1f >> 5) + 1;
      uVar3 = uVar3 + 1 & 0x1f;
      pFVar10 = (FedInfo *)((long)&(*ppFVar11)->fed + (ulong)(uVar3 << 4));
    }
  }
  ActionMessage::ActionMessage(&local_1a0,cmd_stop);
  BrokerBase::addActionMessage(&this->super_BrokerBase,&local_1a0);
  ActionMessage::~ActionMessage(&local_1a0);
  ActionMessage::~ActionMessage(&local_e8);
  return;
}

Assistant:

void CommonCore::processTimingTick(ActionMessage& cmd)
{
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::PING_RESPONSE) ||
        isReasonForTick(cmd.messageID, TickForwardingReasons::NO_COMMS)) {
        if (getBrokerState() == BrokerState::OPERATING) {
            timeoutMon->tick(this);
            LOG_SUMMARY(global_broker_id_local, getIdentifier(), " core tick");
        }
    }
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::QUERY_TIMEOUT)) {
        checkQueryTimeouts();
    }
    if (isReasonForTick(cmd.messageID, TickForwardingReasons::DISCONNECT_TIMEOUT)) {
        auto now = std::chrono::steady_clock::now();
        if (now - disconnectTime > (3 * tickTimer).to_ms()) {
            LOG_WARNING(global_broker_id_local,
                        getIdentifier(),
                        " disconnect Timer expired forcing disconnect");
            ActionMessage bye(CMD_DISCONNECT_FED_ACK);
            bye.source_id = parent_broker_id;
            for (FedInfo fed : loopFederates) {
                if (fed->getState() != FederateStates::FINISHED) {
                    bye.dest_id = fed->global_id.load();
                    fed->addAction(bye);
                }
            }
            addActionMessage(CMD_STOP);
        }
    }
}